

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

void secp256k1_write_be64(uchar *p,uint64_t x)

{
  uint64_t x_local;
  uchar *p_local;
  
  p[7] = (uchar)x;
  p[6] = (uchar)(x >> 8);
  p[5] = (uchar)(x >> 0x10);
  p[4] = (uchar)(x >> 0x18);
  p[3] = (uchar)(x >> 0x20);
  p[2] = (uchar)(x >> 0x28);
  p[1] = (uchar)(x >> 0x30);
  *p = (uchar)(x >> 0x38);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_write_be64(unsigned char* p, uint64_t x) {
    p[7] = x;
    p[6] = x >>  8;
    p[5] = x >> 16;
    p[4] = x >> 24;
    p[3] = x >> 32;
    p[2] = x >> 40;
    p[1] = x >> 48;
    p[0] = x >> 56;
}